

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O0

void duckdb_mbedtls::MbedTlsWrapper::Hmac256
               (char *key,size_t key_len,char *message,size_t message_len,char *out)

{
  int iVar1;
  mbedtls_md_info_t *pmVar2;
  runtime_error *prVar3;
  mbedtls_md_context_t *in_R8;
  mbedtls_md_info_t *md_type;
  mbedtls_md_context_t hmac_ctx;
  size_t in_stack_ffffffffffffff98;
  mbedtls_md_context_t *in_stack_ffffffffffffffa0;
  mbedtls_md_context_t *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  
  pmVar2 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
  if (pmVar2 == (mbedtls_md_info_t *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"failed to init hmac");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = mbedtls_md_setup(in_stack_ffffffffffffffa8,(mbedtls_md_info_t *)in_stack_ffffffffffffffa0,
                           (int)(in_stack_ffffffffffffff98 >> 0x20));
  if (iVar1 == 0) {
    iVar1 = mbedtls_md_hmac_starts(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      iVar1 = mbedtls_md_hmac_update
                        (in_stack_ffffffffffffffa8,(uchar *)in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98);
      if (iVar1 == 0) {
        iVar1 = mbedtls_md_hmac_finish(in_R8,in_stack_ffffffffffffffd0);
        if (iVar1 == 0) {
          mbedtls_md_free(in_stack_ffffffffffffffa0);
          return;
        }
      }
    }
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"HMAC256 Error");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MbedTlsWrapper::Hmac256(const char *key, size_t key_len, const char *message, size_t message_len, char *out) {
	mbedtls_md_context_t hmac_ctx;
	const mbedtls_md_info_t *md_type = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
	if (!md_type) {
		throw runtime_error("failed to init hmac");
	}

	if (mbedtls_md_setup(&hmac_ctx, md_type, 1) ||
	    mbedtls_md_hmac_starts(&hmac_ctx, reinterpret_cast<const unsigned char *>(key), key_len) ||
	    mbedtls_md_hmac_update(&hmac_ctx, reinterpret_cast<const unsigned char *>(message), message_len) ||
	    mbedtls_md_hmac_finish(&hmac_ctx, reinterpret_cast<unsigned char *>(out))) {
		throw runtime_error("HMAC256 Error");
	}
	mbedtls_md_free(&hmac_ctx);
}